

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# positive.hpp
# Opt level: O1

type __thiscall
boost::spirit::classic::
positive<boost::spirit::classic::action<boost::spirit::classic::rule<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,boost::spirit::classic::iteration_policy>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>,boost::spirit::classic::nil_t,boost::spirit::classic::nil_t>,POMDPFormatParsing::ParserPOMDPFormat_Spirit::AddState>>
::
parse<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,boost::spirit::classic::iteration_policy>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>>
          (positive<boost::spirit::classic::action<boost::spirit::classic::rule<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,boost::spirit::classic::iteration_policy>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>,boost::spirit::classic::nil_t,boost::spirit::classic::nil_t>,POMDPFormatParsing::ParserPOMDPFormat_Spirit::AddState>>
           *this,scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>,_boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,_boost::spirit::classic::iteration_policy>,_boost::spirit::classic::match_policy,_boost::spirit::classic::action_policy>_>
                 *scan)

{
  type tVar1;
  type tVar2;
  iterator_t save;
  position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
  pStack_98;
  
  tVar1 = action<boost::spirit::classic::rule<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,boost::spirit::classic::iteration_policy>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>,boost::spirit::classic::nil_t,boost::spirit::classic::nil_t>,POMDPFormatParsing::ParserPOMDPFormat_Spirit::AddState>
          ::
          parse<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,boost::spirit::classic::iteration_policy>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>>
                    ((action<boost::spirit::classic::rule<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,boost::spirit::classic::iteration_policy>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>,boost::spirit::classic::nil_t,boost::spirit::classic::nil_t>,POMDPFormatParsing::ParserPOMDPFormat_Spirit::AddState>
                      *)this,scan);
  if (-1 < tVar1.len) {
    do {
      position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
      ::position_iterator(&pStack_98,scan->first);
      tVar2 = action<boost::spirit::classic::rule<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,boost::spirit::classic::iteration_policy>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>,boost::spirit::classic::nil_t,boost::spirit::classic::nil_t>,POMDPFormatParsing::ParserPOMDPFormat_Spirit::AddState>
              ::
              parse<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,boost::spirit::classic::iteration_policy>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>>
                        ((action<boost::spirit::classic::rule<boost::spirit::classic::scanner<boost::spirit::classic::position_iterator<boost::spirit::classic::file_iterator<char,boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>>,boost::spirit::classic::file_position_base<std::__cxx11::string>,boost::spirit::classic::nil_t>,boost::spirit::classic::scanner_policies<boost::spirit::classic::skip_parser_iteration_policy<comment_cbonlp::CommentBlankorNewLineParser,boost::spirit::classic::iteration_policy>,boost::spirit::classic::match_policy,boost::spirit::classic::action_policy>>,boost::spirit::classic::nil_t,boost::spirit::classic::nil_t>,POMDPFormatParsing::ParserPOMDPFormat_Spirit::AddState>
                          *)this,scan);
      if (tVar2.len < 0) {
        position_iterator<boost::spirit::classic::file_iterator<char,_boost::spirit::classic::fileiter_impl::mmap_file_iterator<char>_>,_boost::spirit::classic::file_position_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::spirit::classic::nil_t>
        ::operator=(scan->first,&pStack_98);
      }
      else {
        tVar1.len = tVar1.len + tVar2.len;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pStack_98._pos.
             super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             .file._M_dataplus._M_p !=
          &pStack_98._pos.
           super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .file.field_2) {
        operator_delete(pStack_98._pos.
                        super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .file._M_dataplus._M_p,
                        pStack_98._pos.
                        super_file_position_without_column_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        .file.field_2._M_allocated_capacity + 1);
      }
      detail::shared_count::~shared_count(&pStack_98._end.super_type.m_iterator.m_mem.pn);
      detail::shared_count::~shared_count
                ((shared_count *)
                 ((long)&pStack_98.super_type.m_iterator.super_type.m_iterator.m_mem + 8));
    } while (-1 < tVar2.len);
  }
  return (type)tVar1.len;
}

Assistant:

typename parser_result<self_t, ScannerT>::type
        parse(ScannerT const& scan) const
        {
            typedef typename parser_result<self_t, ScannerT>::type result_t;
            typedef typename ScannerT::iterator_t iterator_t;
            result_t hit = this->subject().parse(scan);
    
            if (hit)
            {
                for (;;)
                {
                    iterator_t save = scan.first;
                    if (result_t next = this->subject().parse(scan))
                    {
                        scan.concat_match(hit, next);
                    }
                    else
                    {
                        scan.first = save;
                        break;
                    }
                }
            }
            return hit;
        }